

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMPhysicalAvailable(void)

{
  int64_t iVar1;
  int64_t iVar2;
  
  iVar1 = GetRAMPhysicalTotal();
  iVar2 = GetRAMPhysicalUsed();
  return iVar1 - iVar2;
}

Assistant:

int64_t npas4::GetRAMPhysicalAvailable()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullAvailPhys);
#else
	return npas4::GetRAMPhysicalTotal() - npas4::GetRAMPhysicalUsed();
#endif
}